

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::flush_to_console
          (writer_base<cppwinrt::writer> *this,bool to_stdout)

{
  size_type sVar1;
  char *pcVar2;
  FILE *local_40;
  FILE *local_28;
  bool to_stdout_local;
  writer_base<cppwinrt::writer> *this_local;
  
  if (to_stdout) {
    local_28 = _stdout;
  }
  else {
    local_28 = _stderr;
  }
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_first);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->m_first);
  fprintf(local_28,"%.*s",sVar1 & 0xffffffff,pcVar2);
  if (to_stdout) {
    local_40 = _stdout;
  }
  else {
    local_40 = _stderr;
  }
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_second);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->m_second);
  fprintf(local_40,"%.*s",sVar1 & 0xffffffff,pcVar2);
  std::vector<char,_std::allocator<char>_>::clear(&this->m_first);
  std::vector<char,_std::allocator<char>_>::clear(&this->m_second);
  return;
}

Assistant:

void flush_to_console(bool to_stdout = true) noexcept
        {
            fprintf(to_stdout ? stdout : stderr, "%.*s", static_cast<int>(m_first.size()), m_first.data());
            fprintf(to_stdout ? stdout : stderr, "%.*s", static_cast<int>(m_second.size()), m_second.data());
            m_first.clear();
            m_second.clear();
        }